

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::object::write_compact<std::ostream,pstore::dump::object_char_traits>
          (object *this,basic_ostream<char,_std::char_traits<char>_> *os,
          object_strings<pstore::dump::object_char_traits> *strings)

{
  pointer pmVar1;
  element_type *peVar2;
  object_strings<pstore::dump::object_char_traits> *poVar3;
  pointer p;
  undefined4 local_4c;
  object_strings<pstore::dump::object_char_traits> *local_48;
  value local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::operator<<(os,(string *)&strings->openbrace_str);
  pmVar1 = (this->members_).
           super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar3 = strings;
  local_48 = strings;
  for (p = (this->members_).
           super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ._M_impl.super__Vector_impl_data._M_start; p != pmVar1; p = p + 1) {
    std::operator<<(os,(string *)poVar3);
    property((object *)&local_40,&p->property);
    local_4c = 0;
    (**(code **)(*local_40._vptr_value + 0xa8))(local_40._vptr_value,os,&local_4c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::operator<<(os,(string *)&strings->colon_space_str);
    peVar2 = (p->val).super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_value[0x13])(peVar2,os);
    poVar3 = (object_strings<pstore::dump::object_char_traits> *)&strings->comma_space_str;
  }
  std::operator<<(os,(string *)&local_48->space_closebrace_str);
  return os;
}

Assistant:

OStream &
        object::write_compact (OStream & os,
                               object_strings<ObjectCharacterTraits> const & strings) const {
            os << strings.openbrace_str;
            auto const * separator = &strings.space_str;
            for (object::member const & kvp : members_) {
                os << *separator;
                object::property (kvp.property)->write (os);
                os << strings.colon_space_str;
                kvp.val->write (os);
                separator = &strings.comma_space_str;
            }
            os << strings.space_closebrace_str;
            return os;
        }